

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_avx2.c
# Opt level: O1

void aom_quantize_b_64x64_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar8 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])zbin_ptr),0x54);
  auVar10._8_2_ = 2;
  auVar10._0_8_ = 0x2000200020002;
  auVar10._10_2_ = 2;
  auVar10._12_2_ = 2;
  auVar10._14_2_ = 2;
  auVar10._16_2_ = 2;
  auVar10._18_2_ = 2;
  auVar10._20_2_ = 2;
  auVar10._22_2_ = 2;
  auVar10._24_2_ = 2;
  auVar10._26_2_ = 2;
  auVar10._28_2_ = 2;
  auVar10._30_2_ = 2;
  auVar8 = vpaddw_avx2(auVar8,auVar10);
  auVar11 = vpsraw_avx2(auVar8,2);
  auVar8 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])round_ptr),0x54);
  auVar8 = vpaddw_avx2(auVar8,auVar10);
  auVar12 = vpsraw_avx2(auVar8,2);
  auVar1 = *(undefined1 (*) [16])quant_ptr;
  auVar2 = *(undefined1 (*) [16])dequant_ptr;
  auVar3 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar10 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar8 = vpabsw_avx2(auVar10);
  auVar13 = vpcmpgtw_avx2(auVar11,auVar8);
  if (((uint)(SUB321(auVar13 >> 7,0) & 1) | (uint)(SUB321(auVar13 >> 0xf,0) & 1) << 1 |
       (uint)(SUB321(auVar13 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar13 >> 0x1f,0) & 1) << 3 |
       (uint)(SUB321(auVar13 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar13 >> 0x2f,0) & 1) << 5 |
       (uint)(SUB321(auVar13 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar13 >> 0x3f,0) & 1) << 7 |
       (uint)(SUB321(auVar13 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar13 >> 0x4f,0) & 1) << 9 |
       (uint)(SUB321(auVar13 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar13 >> 0x5f,0) & 1) << 0xb |
       (uint)(SUB321(auVar13 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar13 >> 0x6f,0) & 1) << 0xd |
       (uint)(SUB321(auVar13 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar13 >> 0x7f,0) << 0xf |
       (uint)(SUB321(auVar13 >> 0x87,0) & 1) << 0x10 | (uint)(SUB321(auVar13 >> 0x8f,0) & 1) << 0x11
       | (uint)(SUB321(auVar13 >> 0x97,0) & 1) << 0x12 |
       (uint)(SUB321(auVar13 >> 0x9f,0) & 1) << 0x13 | (uint)(SUB321(auVar13 >> 0xa7,0) & 1) << 0x14
       | (uint)(SUB321(auVar13 >> 0xaf,0) & 1) << 0x15 |
       (uint)(SUB321(auVar13 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar13 >> 0xbf,0) << 0x17 |
       (uint)(SUB321(auVar13 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar13 >> 0xcf,0) & 1) << 0x19
       | (uint)(SUB321(auVar13 >> 0xd7,0) & 1) << 0x1a |
       (uint)(SUB321(auVar13 >> 0xdf,0) & 1) << 0x1b | (uint)(SUB321(auVar13 >> 0xe7,0) & 1) << 0x1c
       | (uint)(SUB321(auVar13 >> 0xef,0) & 1) << 0x1d |
       (uint)(SUB321(auVar13 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar13[0x1f] >> 7) << 0x1f) ==
      0xffffffff) {
    auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar8;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar8;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar8;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar8;
  }
  else {
    auVar8 = vpaddsw_avx2(auVar8,auVar12);
    auVar8 = vpandn_avx2(auVar13,auVar8);
    auVar13 = vpermq_avx2(ZEXT1632(auVar1),0x54);
    auVar13 = vpmulhw_avx2(auVar13,auVar8);
    auVar8 = vpaddw_avx2(auVar13,auVar8);
    auVar9 = vpermq_avx2(ZEXT1632(auVar3),0x54);
    auVar13 = vpmulhw_avx2(auVar9,auVar8);
    auVar8 = vpmullw_avx2(auVar9,auVar8);
    auVar8 = vpsrlw_avx2(auVar8,0xe);
    auVar13 = vpsllw_avx2(auVar13,2);
    auVar9 = vpor_avx2(auVar13,auVar8);
    auVar13 = vpermq_avx2(ZEXT1632(auVar2),0x54);
    auVar8 = vpmulhw_avx2(auVar13,auVar9);
    auVar13 = vpmullw_avx2(auVar13,auVar9);
    auVar13 = vpsrlw_avx2(auVar13,2);
    auVar8 = vpsllw_avx2(auVar8,0xe);
    auVar8 = vpor_avx2(auVar8,auVar13);
    auVar5 = vpsignw_avx2(auVar8,auVar10);
    auVar10 = vpsignw_avx2(auVar9,auVar10);
    auVar8 = vpcmpgtw_avx2(auVar9,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar9 = vpsraw_avx2(auVar10,0xf);
    auVar13 = vpunpcklwd_avx2(auVar10,auVar9);
    auVar10 = vpunpckhwd_avx2(auVar10,auVar9);
    *(undefined1 (*) [32])qcoeff_ptr = auVar13;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar10;
    auVar10 = vpsraw_avx2(auVar5,0xf);
    auVar13 = vpunpcklwd_avx2(auVar5,auVar10);
    auVar10 = vpunpckhwd_avx2(auVar5,auVar10);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar13;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar10;
  }
  auVar10 = vpermq_avx2(*(undefined1 (*) [32])iscan,0xd8);
  auVar10 = vpsubw_avx2(auVar10,auVar8);
  auVar8 = vpand_avx2(auVar10,auVar8);
  auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar8 = vpmaxsw_avx2(auVar8,auVar10);
  if (0x10 < n_coeffs) {
    auVar13 = vpcmpeqd_avx2(auVar13,auVar13);
    auVar13 = vpaddw_avx2(auVar11,auVar13);
    auVar13 = vpshufd_avx2(auVar13,0xee);
    auVar11 = vpshufd_avx2(auVar12,0xee);
    auVar12 = vpermq_avx2(ZEXT1632(auVar1),0x55);
    auVar9 = vpermq_avx2(ZEXT1632(auVar3),0x55);
    auVar5 = vpermq_avx2(ZEXT1632(auVar2),0x55);
    lVar7 = n_coeffs + 0x10;
    lVar6 = 0;
    do {
      auVar16 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar6 * 2 + 0x40),
                               *(undefined1 (*) [32])((long)coeff_ptr + lVar6 * 2 + 0x60));
      auVar14 = vpabsw_avx2(auVar16);
      auVar17 = vpcmpgtw_avx2(auVar14,auVar13);
      if ((((((((((((((((((((((((((((((((auVar17 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar17 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar17 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar17 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar17 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar17 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar17 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar17 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar17 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar17 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar17 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar17 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar17 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar17 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar17 >> 0x7f,0) == '\0') &&
                        (auVar17 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar17 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar17 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar17 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar17 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar17 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar17 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar17 >> 0xbf,0) == '\0') &&
                (auVar17 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar17 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar17 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar17 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar17 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar17 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar17 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar17[0x1f])
      {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar6 * 2 + 0x40) = auVar10;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar6 * 2 + 0x40) = auVar10;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar6 * 2 + 0x60) = auVar10;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar6 * 2 + 0x60) = auVar10;
        auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar14 = vpaddsw_avx2(auVar14,auVar11);
        auVar14 = vpand_avx2(auVar17,auVar14);
        auVar17 = vpmulhw_avx2(auVar14,auVar12);
        auVar14 = vpaddw_avx2(auVar17,auVar14);
        auVar17 = vpmulhw_avx2(auVar14,auVar9);
        auVar14 = vpmullw_avx2(auVar14,auVar9);
        auVar14 = vpsrlw_avx2(auVar14,0xe);
        auVar17 = vpsllw_avx2(auVar17,2);
        auVar4 = vpor_avx2(auVar17,auVar14);
        auVar14 = vpmulhw_avx2(auVar4,auVar5);
        auVar17 = vpmullw_avx2(auVar4,auVar5);
        auVar17 = vpsrlw_avx2(auVar17,2);
        auVar14 = vpsllw_avx2(auVar14,0xe);
        auVar14 = vpor_avx2(auVar14,auVar17);
        auVar17 = vpsignw_avx2(auVar14,auVar16);
        auVar16 = vpsignw_avx2(auVar4,auVar16);
        auVar14 = vpcmpgtw_avx2(auVar4,auVar10);
        auVar15 = vpsraw_avx2(auVar16,0xf);
        auVar4 = vpunpcklwd_avx2(auVar16,auVar15);
        auVar16 = vpunpckhwd_avx2(auVar16,auVar15);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar6 * 2 + 0x40) = auVar4;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar6 * 2 + 0x60) = auVar16;
        auVar16 = vpsraw_avx2(auVar17,0xf);
        auVar4 = vpunpcklwd_avx2(auVar17,auVar16);
        auVar16 = vpunpckhwd_avx2(auVar17,auVar16);
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar6 * 2 + 0x40) = auVar4;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar6 * 2 + 0x60) = auVar16;
      }
      auVar16 = vpermq_avx2(*(undefined1 (*) [32])((long)iscan + lVar6 + 0x20),0xd8);
      auVar16 = vpsubw_avx2(auVar16,auVar14);
      auVar14 = vpand_avx2(auVar16,auVar14);
      auVar8 = vpmaxsw_avx2(auVar8,auVar14);
      lVar7 = lVar7 + -0x10;
      lVar6 = lVar6 + 0x20;
    } while (0x20 < lVar7);
  }
  auVar1 = vpmaxsw_avx(auVar8._0_16_,auVar8._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,0xe);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  auVar2 = vpshuflw_avx(auVar1,1);
  auVar1 = vpmaxsw_avx(auVar1,auVar2);
  vpextrw_avx(auVar1,1);
  return;
}

Assistant:

void aom_quantize_b_64x64_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                               const int16_t *zbin_ptr,
                               const int16_t *round_ptr,
                               const int16_t *quant_ptr,
                               const int16_t *quant_shift_ptr,
                               tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                               const int16_t *dequant_ptr, uint16_t *eob_ptr,
                               const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  quantize_b_no_qmatrix_avx2(coeff_ptr, n_coeffs, zbin_ptr, round_ptr,
                             quant_ptr, quant_shift_ptr, qcoeff_ptr,
                             dqcoeff_ptr, dequant_ptr, eob_ptr, iscan, 2);
}